

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioCtl.cc
# Opt level: O1

void __thiscall AudioCtl::timeShift(AudioCtl *this,int rows)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = (this->pos_).super___atomic_base<int>._M_i;
  iVar2 = this->end_;
  iVar3 = this->start_;
  iVar8 = iVar2 - iVar3;
  iVar7 = rows * this->settings_->samples_per_row;
  iVar6 = iVar7 + iVar1;
  iVar5 = iVar6;
  if (iVar6 < iVar3) {
    iVar5 = iVar3;
  }
  iVar6 = (((iVar5 - (iVar6 + (uint)(iVar6 < iVar3))) / (iVar8 + (uint)(iVar8 == 0)) +
           (uint)(iVar6 < iVar3)) * iVar8 + iVar1 + iVar2 + iVar7) - iVar3;
  do {
    iVar6 = iVar6 + (iVar3 - iVar2);
  } while (iVar2 < iVar6);
  LOCK();
  (this->pos_).super___atomic_base<int>._M_i = iVar6;
  UNLOCK();
  lVar4 = (long)this->settings_->samples_per_row;
  aAppDebugPrintf("pos = %d",(long)iVar6 / lVar4 & 0xffffffff,(long)iVar6 % lVar4 & 0xffffffff);
  return;
}

Assistant:

void AudioCtl::timeShift(int rows) noexcept {
	int next_pos = pos_ + rows * settings_.samples_per_row;
	const int loop_length = end_ - start_;
	while (next_pos < start_)
		next_pos += loop_length;
	while (next_pos > end_)
		next_pos -= loop_length;
	pos_ = next_pos;
	MSG("pos = %d", next_pos / settings_.samples_per_row);
}